

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_addon.hpp
# Opt level: O1

back_insert_iterator<std::vector<zmq::message_t,_std::allocator<zmq::message_t>_>_>
zmq::decode<std::back_insert_iterator<std::vector<zmq::message_t,std::allocator<zmq::message_t>>>>
          (message_t *encoded,
          back_insert_iterator<std::vector<zmq::message_t,_std::allocator<zmq::message_t>_>_> out)

{
  uint uVar1;
  byte *pbVar2;
  long lVar3;
  out_of_range *this;
  byte *pbVar4;
  byte *data_;
  ulong size_;
  message_t local_70;
  
  pbVar2 = (byte *)zmq_msg_data();
  lVar3 = zmq_msg_size(encoded);
  pbVar4 = pbVar2 + lVar3;
  if (0 < lVar3) {
    do {
      data_ = pbVar2 + 1;
      size_ = (ulong)*pbVar2;
      if (size_ == 0xff) {
        if ((ulong)((long)pbVar4 - (long)data_) < 4) {
          this = (out_of_range *)__cxa_allocate_exception(0x10);
          std::out_of_range::out_of_range(this,"Malformed encoding, overflow in reading size");
          goto LAB_0014e8c5;
        }
        uVar1 = *(uint *)(pbVar2 + 1);
        size_ = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                       uVar1 << 0x18);
        data_ = pbVar2 + 5;
      }
      if ((ulong)((long)pbVar4 - (long)data_) < size_) {
        this = (out_of_range *)__cxa_allocate_exception(0x10);
        std::out_of_range::out_of_range(this,"Malformed encoding, overflow in reading part");
LAB_0014e8c5:
        __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
      }
      message_t::message_t(&local_70,data_,size_);
      std::vector<zmq::message_t,_std::allocator<zmq::message_t>_>::emplace_back<zmq::message_t>
                (out.container,&local_70);
      message_t::~message_t(&local_70);
      pbVar2 = data_ + size_;
    } while (pbVar2 < pbVar4);
  }
  if (pbVar2 != pbVar4) {
    __assert_fail("source == limit",
                  "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq_addon.hpp",
                  0x166,
                  "OutputIt zmq::decode(const message_t &, OutputIt) [OutputIt = std::back_insert_iterator<std::vector<zmq::message_t>>]"
                 );
  }
  return (back_insert_iterator<std::vector<zmq::message_t,_std::allocator<zmq::message_t>_>_>)
         (back_insert_iterator<std::vector<zmq::message_t,_std::allocator<zmq::message_t>_>_>)
         out.container;
}

Assistant:

OutputIt decode(const message_t &encoded, OutputIt out)
{
    const unsigned char *source = encoded.data<unsigned char>();
    const unsigned char *const limit = source + encoded.size();

    while (source < limit) {
        size_t part_size = *source++;
        if (part_size == (std::numeric_limits<std::uint8_t>::max)()) {
            if (static_cast<size_t>(limit - source) < sizeof(uint32_t)) {
                throw std::out_of_range(
                  "Malformed encoding, overflow in reading size");
            }
            part_size = detail::read_u32_network_order(source);
            // the part size is allowed to be less than 0xFF
            source += sizeof(uint32_t);
        }

        if (static_cast<size_t>(limit - source) < part_size) {
            throw std::out_of_range("Malformed encoding, overflow in reading part");
        }
        *out = message_t(source, part_size);
        ++out;
        source += part_size;
    }

    assert(source == limit);
    return out;
}